

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::mdc_formatter<spdlog::details::null_scoped_padder>::format_mdc
          (mdc_formatter<spdlog::details::null_scoped_padder> *this,mdc_map_t *mdc_map,
          memory_buf_t *dest)

{
  bool bVar1;
  _Self *p_Var2;
  reference s;
  long lVar3;
  long lVar4;
  memory_buf_t *pmVar5;
  _Self dest_00;
  string_view_t view;
  string_view_t view_00;
  string_view_t view_01;
  string_view_t view_02;
  basic_string_view<char> local_b8;
  fmt_helper *local_a8;
  basic_string_view<char> local_98;
  null_scoped_padder local_81;
  size_t sStack_80;
  null_scoped_padder p;
  size_t content_size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pair;
  _Self local_58;
  const_iterator it;
  _Self local_48;
  _Self last_element;
  memory_buf_t *dest_local;
  mdc_map_t *mdc_map_local;
  mdc_formatter<spdlog::details::null_scoped_padder> *this_local;
  
  last_element._M_node = (_Base_ptr)dest;
  it = std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(mdc_map);
  p_Var2 = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator--(&it);
  local_48._M_node = p_Var2->_M_node;
  local_58._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::begin(mdc_map);
  while( true ) {
    pair = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::end(mdc_map);
    bVar1 = std::operator!=(&local_58,(_Self *)&pair);
    if (!bVar1) break;
    s = std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator*(&local_58);
    lVar3 = std::__cxx11::string::size();
    lVar4 = std::__cxx11::string::size();
    sStack_80 = lVar3 + lVar4 + 1;
    bVar1 = std::operator!=(&local_58,&local_48);
    if (bVar1) {
      sStack_80 = sStack_80 + 1;
    }
    dest_00 = last_element;
    null_scoped_padder::null_scoped_padder
              (&local_81,sStack_80,&(this->super_flag_formatter).padinfo_,
               (memory_buf_t *)last_element._M_node);
    fmt::v10::basic_string_view<char>::
    basic_string_view<std::char_traits<char>,std::allocator<char>>(&local_98,&s->first);
    view.size_ = (size_t)last_element._M_node;
    view.data_ = (char *)local_98.size_;
    fmt_helper::append_string_view
              ((fmt_helper *)local_98.data_,view,(memory_buf_t *)dest_00._M_node);
    local_a8 = (fmt_helper *)0x4e08f3;
    pmVar5 = (memory_buf_t *)std::char_traits<char>::length(":");
    view_00.size_ = (size_t)last_element._M_node;
    view_00.data_ = (char *)pmVar5;
    fmt_helper::append_string_view(local_a8,view_00,pmVar5);
    fmt::v10::basic_string_view<char>::
    basic_string_view<std::char_traits<char>,std::allocator<char>>(&local_b8,&s->second);
    view_01.size_ = (size_t)last_element._M_node;
    view_01.data_ = (char *)local_b8.size_;
    fmt_helper::append_string_view((fmt_helper *)local_b8.data_,view_01,pmVar5);
    bVar1 = std::operator!=(&local_58,&local_48);
    if (bVar1) {
      pmVar5 = (memory_buf_t *)std::char_traits<char>::length(" ");
      view_02.size_ = (size_t)last_element._M_node;
      view_02.data_ = (char *)pmVar5;
      fmt_helper::append_string_view((fmt_helper *)0x4dde7d,view_02,pmVar5);
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&local_58);
  }
  return;
}

Assistant:

void format_mdc(const mdc::mdc_map_t &mdc_map, memory_buf_t &dest) {
        auto last_element = --mdc_map.end();
        for (auto it = mdc_map.begin(); it != mdc_map.end(); ++it) {
            auto &pair = *it;
            const auto &key = pair.first;
            const auto &value = pair.second;
            size_t content_size = key.size() + value.size() + 1;  // 1 for ':'

            if (it != last_element) {
                content_size++;  // 1 for ' '
            }

            ScopedPadder p(content_size, padinfo_, dest);
            fmt_helper::append_string_view(key, dest);
            fmt_helper::append_string_view(":", dest);
            fmt_helper::append_string_view(value, dest);
            if (it != last_element) {
                fmt_helper::append_string_view(" ", dest);
            }
        }
    }